

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O2

void __thiscall pbrt::syntactic::Token::Token(Token *this,Loc *loc,Type type,string *text)

{
  Loc::Loc(&this->loc,loc);
  this->type = type;
  std::__cxx11::string::string((string *)&this->text,(string *)text);
  return;
}

Assistant:

Token(const Loc &loc, const Type type, const std::string& text) : loc{loc}, type{type}, text{text} { }